

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O2

int IoCommandReadJson(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char *__filename;
  int iVar1;
  Abc_Nam_t *in_RAX;
  FILE *__stream;
  Vec_Wec_t *vObjs;
  Abc_Nam_t *pStrs;
  
  pStrs = in_RAX;
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if ((iVar1 == -1) && (globalUtilOptind + 1 == argc)) {
    __filename = argv[globalUtilOptind];
    __stream = fopen(__filename,"r");
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
      vObjs = Json_Read(__filename,&pStrs);
      if (vObjs == (Vec_Wec_t *)0x0) {
        return 0;
      }
      Abc_FrameSetJsonStrs(pStrs);
      Abc_FrameSetJsonObjs(vObjs);
      return 0;
    }
    fprintf((FILE *)pAbc->Err,"Cannot open input file \"%s\". \n",__filename);
  }
  else {
    fwrite("usage: read_json [-h] <file>\n",0x1d,1,(FILE *)pAbc->Err);
    fwrite("\t         reads file in JSON format\n",0x24,1,(FILE *)pAbc->Err);
    fwrite("\t-h     : prints the command summary\n",0x25,1,(FILE *)pAbc->Err);
    fwrite("\tfile   : the name of a file to read\n",0x25,1,(FILE *)pAbc->Err);
  }
  return 1;
}

Assistant:

int IoCommandReadJson( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Vec_Wec_t * Json_Read( char * pFileName, Abc_Nam_t ** ppStrs );
    Vec_Wec_t * vObjs;
    Abc_Nam_t * pStrs;
    char * pFileName;
    FILE * pFile;
    int c;

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
            case 'h':
                goto usage;
            default:
                goto usage;
        }
    }
    if ( argc != globalUtilOptind + 1 )
    {
        goto usage;
    }

    // get the input file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        fprintf( pAbc->Err, "Cannot open input file \"%s\". \n", pFileName );
        return 1;
    }
    fclose( pFile );

    // set the new network
    vObjs = Json_Read( pFileName, &pStrs );
    if ( vObjs == NULL )
        return 0;
    Abc_FrameSetJsonStrs( pStrs );
    Abc_FrameSetJsonObjs( vObjs );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: read_json [-h] <file>\n" );
    fprintf( pAbc->Err, "\t         reads file in JSON format\n" );
    fprintf( pAbc->Err, "\t-h     : prints the command summary\n" );
    fprintf( pAbc->Err, "\tfile   : the name of a file to read\n" );
    return 1;
}